

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::OurReader::readObject(OurReader *this,Token *token)

{
  anon_struct_4_2_14fb5ae2_for_bits_ aVar1;
  ValueHolder *pVVar2;
  ValueHolder VVar3;
  TokenType TVar4;
  bool bVar5;
  Value *pVVar6;
  long *plVar7;
  _Elt_pointer ppVVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  byte unaff_R13B;
  byte bVar10;
  char cVar11;
  Value numberName;
  String name;
  Token colon;
  Value init;
  Token comma;
  Token tokenName;
  ValueHolder local_f0;
  long local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  String local_c8;
  String local_a8;
  ValueHolder local_88;
  anon_struct_4_2_14fb5ae2_for_bits_ local_80;
  Token local_60;
  Token local_48;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  Value::Value((Value *)&local_88,objectValue);
  ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar8 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pVVar2 = &ppVVar8[-1]->value_;
  aVar1 = *(anon_struct_4_2_14fb5ae2_for_bits_ *)(pVVar2 + 1);
  *(anon_struct_4_2_14fb5ae2_for_bits_ *)(pVVar2 + 1) = local_80;
  VVar3 = *pVVar2;
  *pVVar2 = local_88;
  ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar8 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ppVVar8[-1]->start_ = (long)token->start_ - (long)this->begin_;
  local_88 = VVar3;
  local_80 = aVar1;
  do {
    bVar5 = readToken(this,&local_48);
    if (!bVar5) goto LAB_0010b3e2;
    bVar5 = true;
    while ((TVar4 = local_48.type_, bVar5 != false && (local_48.type_ == tokenComment))) {
      bVar5 = readToken(this,&local_48);
    }
    if (bVar5 == false) goto LAB_0010b0de;
    if (local_48.type_ == tokenObjectEnd) {
      cVar11 = '\x01';
      bVar10 = 1;
      if ((local_c8._M_string_length != 0) && ((this->features_).allowTrailingCommas_ == false))
      goto LAB_0010b028;
    }
    else {
LAB_0010b028:
      local_c8._M_string_length = 0;
      *local_c8._M_dataplus._M_p = '\0';
      if (TVar4 == tokenNumber) {
        if ((this->features_).allowNumericKeys_ != true) goto LAB_0010b0de;
        local_e0._M_allocated_capacity = 0;
        Value::initBasic((Value *)&local_f0,nullValue,false);
        bVar5 = decodeNumber(this,&local_48,(Value *)&local_f0);
        if (bVar5) {
          Value::asString_abi_cxx11_(&local_a8,(Value *)&local_f0);
          std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p) !=
              &local_a8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p)
                            ,local_a8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          recoverFromError(this,tokenObjectEnd);
          unaff_R13B = 0;
        }
        Value::~Value((Value *)&local_f0);
        cVar11 = '\x01';
        bVar10 = unaff_R13B;
        if (bVar5) goto LAB_0010b118;
      }
      else if (TVar4 == tokenString) {
        bVar5 = decodeString(this,&local_48,&local_c8);
        if (bVar5) {
LAB_0010b118:
          if (0x3fffffff < local_c8._M_string_length) {
            local_f0.string_ = (char *)&local_e0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"keylength >= 2^30","");
            throwRuntimeError((String *)&local_f0);
          }
          if ((this->features_).rejectDupKeys_ == true) {
            ppVVar8 = (this->nodes_).c.
                      super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_cur;
            if (ppVVar8 ==
                (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVVar8 = (this->nodes_).c.
                        super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            pVVar6 = Value::find(ppVVar8[-1],local_c8._M_dataplus._M_p,
                                 local_c8._M_dataplus._M_p + local_c8._M_string_length);
            if (pVVar6 == (Value *)0x0) goto LAB_0010b1c3;
            std::operator+(&local_a8,"Duplicate key: \'",&local_c8);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
            local_f0.string_ = (char *)&local_e0;
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 == paVar9) {
              local_e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_e0._8_8_ = plVar7[3];
            }
            else {
              local_e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_f0.string_ = ((char *)*plVar7).string_;
            }
            local_e8 = plVar7[1];
            *plVar7 = (long)paVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p) !=
                &local_a8.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                       (int)local_a8._M_dataplus._M_p),
                              local_a8.field_2._M_allocated_capacity + 1);
            }
            addError(this,(String *)&local_f0,&local_48,(Location)0x0);
            recoverFromError(this,tokenObjectEnd);
          }
          else {
LAB_0010b1c3:
            bVar5 = readToken(this,(Token *)&local_a8);
            if (bVar5 && (int)local_a8._M_dataplus._M_p == 0xe) {
              ppVVar8 = (this->nodes_).c.
                        super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_cur;
              if (ppVVar8 ==
                  (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVVar8 = (this->nodes_).c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
              }
              local_f0.map_ =
                   (ObjectValues *)
                   Value::resolveReference
                             (ppVVar8[-1],local_c8._M_dataplus._M_p,
                              local_c8._M_dataplus._M_p + local_c8._M_string_length);
              std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
                        ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,
                         (Value **)&local_f0.map_);
              bVar5 = readValue(this);
              std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
                        ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
              if (bVar5) {
                bVar5 = readToken(this,&local_60);
                if (((bVar5) && (local_60.type_ < tokenError)) &&
                   ((0xa004U >> (local_60.type_ & (tokenError|tokenComment)) & 1) != 0)) {
                  bVar5 = true;
                  while ((bVar5 != false && (local_60.type_ == tokenComment))) {
                    bVar5 = readToken(this,&local_60);
                  }
                  cVar11 = local_60.type_ == tokenObjectEnd;
                  bVar10 = unaff_R13B | cVar11;
                }
                else {
                  local_f0.string_ = (char *)&local_e0;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_f0,"Missing \',\' or \'}\' in object declaration","");
                  addError(this,(String *)&local_f0,&local_60,(Location)0x0);
                  recoverFromError(this,tokenObjectEnd);
                  if (local_f0 != &local_e0) {
                    operator_delete(local_f0.string_,local_e0._M_allocated_capacity + 1);
                  }
                  cVar11 = '\x01';
                  bVar10 = 0;
                }
                goto LAB_0010b0e6;
              }
              recoverFromError(this,tokenObjectEnd);
              goto LAB_0010b35a;
            }
            local_f0.string_ = (char *)&local_e0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"Missing \':\' after object member name","");
            addError(this,(String *)&local_f0,(Token *)&local_a8,(Location)0x0);
            recoverFromError(this,tokenObjectEnd);
          }
          if (local_f0 != &local_e0) {
            operator_delete(local_f0.string_,local_e0._M_allocated_capacity + 1);
          }
        }
        else {
          recoverFromError(this,tokenObjectEnd);
        }
LAB_0010b35a:
        cVar11 = '\x01';
        bVar10 = 0;
      }
      else {
LAB_0010b0de:
        cVar11 = '\x03';
        bVar10 = unaff_R13B;
      }
    }
LAB_0010b0e6:
    unaff_R13B = bVar10;
  } while (cVar11 == '\0');
  if (cVar11 == '\x03') {
LAB_0010b3e2:
    local_f0.string_ = (char *)&local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"Missing \'}\' or object member name","");
    addError(this,(String *)&local_f0,&local_48,(Location)0x0);
    recoverFromError(this,tokenObjectEnd);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0.string_,local_e0._M_allocated_capacity + 1);
    }
    bVar10 = 0;
  }
  Value::~Value((Value *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  return (bool)(bVar10 & 1);
}

Assistant:

bool OurReader::readObject(Token& token) {
  Token tokenName;
  String name;
  Value init(objectValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(token.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd &&
        (name.empty() ||
         features_.allowTrailingCommas_)) // empty object or trailing comma
      return true;
    name.clear();
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }
    if (name.length() >= (1U << 30))
      throwRuntimeError("keylength >= 2^30");
    if (features_.rejectDupKeys_ && currentValue().isMember(name)) {
      String msg = "Duplicate key: '" + name + "'";
      return addErrorAndRecover(msg, tokenName, tokenObjectEnd);
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover("Missing ':' after object member name", colon,
                                tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover("Missing ',' or '}' in object declaration",
                                comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover("Missing '}' or object member name", tokenName,
                            tokenObjectEnd);
}